

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.h
# Opt level: O1

bool __thiscall draco::PointCloudKdTreeDecoder::DecodeGeometryData(PointCloudKdTreeDecoder *this)

{
  long lVar1;
  DecoderBuffer *pDVar2;
  long lVar3;
  ValueType in_ECX;
  
  pDVar2 = (this->super_PointCloudDecoder).buffer_;
  lVar3 = pDVar2->data_size_;
  lVar1 = pDVar2->pos_ + 4;
  if (lVar1 <= lVar3) {
    in_ECX = *(ValueType *)(pDVar2->data_ + pDVar2->pos_);
    pDVar2->pos_ = lVar1;
  }
  if (-1 < (int)in_ECX && lVar1 <= lVar3) {
    ((this->super_PointCloudDecoder).point_cloud_)->num_points_ = in_ECX;
  }
  return -1 < (int)in_ECX && lVar1 <= lVar3;
}

Assistant:

DecoderBuffer *buffer() { return buffer_; }